

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,Reader proto,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *clientBrand)

{
  SegmentReader **ppSVar1;
  undefined8 *puVar2;
  size_t sVar3;
  Scope *pSVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  Reader type;
  StructReader *pSVar7;
  ListElementCount LVar8;
  ListElementCount LVar9;
  ulong uVar10;
  SegmentReader *pSVar11;
  RawBrandedSchema *pRVar12;
  short sVar13;
  ElementCount index;
  long lVar14;
  PointerReader *__s;
  StructReader *__s_00;
  PointerReader *result;
  ulong uVar15;
  unsigned_long j;
  ulong uVar16;
  Scope *__i;
  ulong uVar17;
  StructReader *pSVar18;
  StringPtr scopeName;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar19;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> AVar20;
  Array<capnp::_::RawBrandedSchema::Scope> dstScopes_heap;
  Reader srcScope;
  Reader srcBinding;
  Reader srcBindings;
  Reader srcScopes;
  Binding dstBindings_stack [16];
  Scope dstScopes_stack [16];
  PointerReader *local_478;
  ulong uStack_470;
  undefined8 *local_468;
  StructReader *local_458;
  ulong uStack_450;
  undefined8 *local_448;
  StructReader local_3e0;
  StructReader local_3b0;
  PointerReader local_380;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_360;
  StructReader local_348;
  ListReader local_318;
  ListReader local_2e8;
  PointerReader local_2b8 [8];
  StructReader local_1b8 [8];
  
  local_2b8[0].pointer = (WirePointer *)schema->encodedNode;
  local_2b8[0].segment = (SegmentReader *)0x0;
  local_2b8[0].capTable = (CapTableReader *)0x0;
  local_2b8[0].nestingLimit = 0x7fffffff;
  _::PointerReader::getStruct(local_1b8,local_2b8,(word *)0x0);
  local_2b8[0].pointer = (WirePointer *)0x0;
  local_2b8[0].segment = (SegmentReader *)0x0;
  local_2b8[0].capTable = (CapTableReader *)(WirePointer *)0x0;
  local_2b8[0].nestingLimit = 0x7fffffff;
  if (local_1b8[0].pointerCount != 0) {
    local_2b8[0].pointer =
         (WirePointer *)CONCAT44(local_1b8[0].pointers._4_4_,(int)local_1b8[0].pointers);
    local_2b8[0].segment = local_1b8[0].segment;
    local_2b8[0].capTable = local_1b8[0].capTable;
    local_2b8[0].nestingLimit = local_1b8[0].nestingLimit;
  }
  scopeName.content =
       (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(local_2b8,(void *)0x0,0);
  local_1b8[0].data = (WirePointer *)0x0;
  local_1b8[0].segment = (SegmentReader *)0x0;
  local_1b8[0].capTable = (CapTableReader *)0x0;
  local_1b8[0].pointers._0_4_ = 0x7fffffff;
  if (proto._reader.pointerCount != 0) {
    local_1b8[0].data = proto._reader.pointers;
    local_1b8[0].segment = proto._reader.segment;
    local_1b8[0].capTable = proto._reader.capTable;
    local_1b8[0].pointers._0_4_ = proto._reader.nestingLimit;
  }
  _::PointerReader::getList(&local_2e8,(PointerReader *)local_1b8,INLINE_COMPOSITE,(word *)0x0);
  LVar9 = local_2e8.elementCount;
  uVar10 = (ulong)local_2e8.elementCount;
  if (uVar10 < 0x11) {
    local_458 = (StructReader *)0x0;
    uStack_450 = 0;
    local_448 = (undefined8 *)0x0;
  }
  else {
    local_458 = (StructReader *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x18,uVar10,uVar10,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
    ;
    local_448 = &kj::_::HeapArrayDisposer::instance;
    uStack_450 = uVar10;
  }
  __s_00 = local_1b8;
  if (0x10 < LVar9) {
    uVar10 = uStack_450;
    __s_00 = local_458;
  }
  uVar15 = 0;
  memset(__s_00,0,uVar10 * 0x18);
  if (local_2e8.elementCount != 0) {
    index = 0;
    uVar10 = 0;
    do {
      _::ListReader::getStructElement(&local_3e0,&local_2e8,index);
      if (local_3e0.dataSize < 0x50) {
        sVar13 = 0;
      }
      else {
        sVar13 = *(short *)((long)local_3e0.data + 8);
      }
      if (sVar13 == 0) {
        local_2b8[0].capTable = local_3e0.capTable;
        local_2b8[0].pointer = local_3e0.pointers;
        local_2b8[0].segment = local_3e0.segment;
        local_2b8[0].nestingLimit = local_3e0.nestingLimit;
        if (local_3e0.pointerCount == 0) {
          local_2b8[0].capTable = (CapTableReader *)(WirePointer *)0x0;
          local_2b8[0].pointer = (WirePointer *)0x0;
          local_2b8[0].segment = (SegmentReader *)0x0;
          local_2b8[0].nestingLimit = 0x7fffffff;
        }
        _::PointerReader::getList(&local_318,local_2b8,INLINE_COMPOSITE,(word *)0x0);
        LVar8 = local_318.elementCount;
        uVar15 = (ulong)local_318.elementCount;
        if (uVar15 < 0x11) {
          local_478 = (PointerReader *)0x0;
          uStack_470 = 0;
          local_468 = (undefined8 *)0x0;
        }
        else {
          local_478 = (PointerReader *)
                      kj::_::HeapArrayDisposer::allocateImpl
                                (0x10,uVar15,uVar15,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
          local_468 = &kj::_::HeapArrayDisposer::instance;
          uStack_470 = uVar15;
        }
        __s = local_2b8;
        if (0x10 < LVar8) {
          __s = local_478;
          uVar15 = uStack_470;
        }
        memset(__s,0,uVar15 << 4);
        uVar17 = (ulong)local_318.elementCount;
        if (uVar17 != 0) {
          uVar16 = 0;
          result = __s;
          do {
            _::ListReader::getStructElement(&local_3b0,&local_318,(ElementCount)uVar16);
            result->segment = (SegmentReader *)0x0;
            result->capTable = (CapTableReader *)0x0;
            *(undefined1 *)&result->segment = 0x12;
            if ((0xf < local_3b0.dataSize) && (*local_3b0.data == 1)) {
              local_380.capTable = local_3b0.capTable;
              local_380.pointer = local_3b0.pointers;
              local_380.segment = local_3b0.segment;
              local_380.nestingLimit = local_3b0.nestingLimit;
              if (local_3b0.pointerCount == 0) {
                local_380.capTable = (CapTableReader *)0x0;
                local_380.pointer = (WirePointer *)0x0;
                local_380.segment = (SegmentReader *)0x0;
                local_380.nestingLimit = 0x7fffffff;
              }
              _::PointerReader::getStruct(&local_348,&local_380,(word *)0x0);
              local_360.ptr.isSet = (clientBrand->ptr).isSet;
              if (local_360.ptr.isSet == true) {
                local_360.ptr.field_1.value.ptr = (clientBrand->ptr).field_1.value.ptr;
                local_360.ptr.field_1.value.size_ = (clientBrand->ptr).field_1.value.size_;
              }
              type._reader.capTable = local_348.capTable;
              type._reader.segment = local_348.segment;
              type._reader.data = local_348.data;
              type._reader.pointers = local_348.pointers;
              type._reader.dataSize = local_348.dataSize;
              type._reader.pointerCount = local_348.pointerCount;
              type._reader._38_2_ = local_348._38_2_;
              type._reader.nestingLimit = local_348.nestingLimit;
              type._reader._44_4_ = local_348._44_4_;
              makeDep(this,(Binding *)result,type,scopeName,&local_360);
            }
            uVar16 = uVar16 + 1;
            result = (PointerReader *)&result->pointer;
          } while (uVar17 != uVar16);
        }
        if (local_3e0.dataSize < 0x40) {
          pSVar11 = (SegmentReader *)0x0;
        }
        else {
          pSVar11 = *local_3e0.data;
        }
        ppSVar1 = &__s_00->segment + uVar10 * 3;
        *ppSVar1 = pSVar11;
        *(int *)(ppSVar1 + 2) = (int)uVar15;
        AVar19.size_ = uVar15;
        AVar19.ptr = (Binding *)__s;
        AVar19 = copyDeduped<capnp::_::RawBrandedSchema::Binding>(this,AVar19);
        ppSVar1[1] = (SegmentReader *)AVar19.ptr;
        if (local_478 != (PointerReader *)0x0) {
          (**(code **)*local_468)(local_468,local_478,0x10,uStack_470,uStack_470,0);
        }
        uVar15 = (ulong)((int)uVar10 + 1);
      }
      else {
        uVar15 = uVar10;
        if (sVar13 == 1) {
          if (local_3e0.dataSize < 0x40) {
            pSVar11 = (SegmentReader *)0x0;
          }
          else {
            pSVar11 = *local_3e0.data;
          }
          uVar15 = (ulong)((int)uVar10 + 1);
          ppSVar1 = &__s_00->segment + uVar10 * 3;
          *ppSVar1 = pSVar11;
          if ((clientBrand->ptr).isSet == true) {
            sVar3 = (clientBrand->ptr).field_1.value.size_;
            if (sVar3 != 0) {
              pSVar4 = (clientBrand->ptr).field_1.value.ptr;
              lVar14 = 0;
              do {
                if (*(SegmentReader **)((long)&pSVar4->typeId + lVar14) == pSVar11) {
                  ppSVar1[2] = (SegmentReader *)
                               *(WirePointer **)((long)&pSVar4->bindingCount + lVar14);
                  puVar2 = (undefined8 *)((long)&pSVar4->typeId + lVar14);
                  pCVar6 = (CapTableReader *)puVar2[1];
                  *ppSVar1 = (SegmentReader *)*puVar2;
                  ppSVar1[1] = (SegmentReader *)pCVar6;
                  break;
                }
                lVar14 = lVar14 + 0x18;
              } while (sVar3 * 0x18 != lVar14);
            }
          }
          else {
            *(undefined1 *)((long)ppSVar1 + 0x14) = 1;
          }
        }
      }
      index = index + 1;
      uVar10 = uVar15;
    } while (index != local_2e8.elementCount);
  }
  if ((uint)uVar15 != 0) {
    ppSVar1 = &__s_00->segment + uVar15 * 3;
    lVar14 = 0x3f;
    if (uVar15 != 0) {
      for (; uVar15 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<capnp::_::RawBrandedSchema::Scope*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
              (__s_00,ppSVar1,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    if ((uint)uVar15 < 0x11) {
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (__s_00,ppSVar1);
    }
    else {
      pSVar18 = local_458;
      if (LVar9 < 0x11) {
        pSVar18 = local_1b8;
      }
      pSVar18 = pSVar18 + 8;
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Scope*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBranded(capnp::_::RawSchema_const*,capnp::schema::Brand::Reader,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (__s_00,pSVar18);
      do {
        pSVar11 = pSVar18->segment;
        local_2b8[0].segment = (SegmentReader *)pSVar18->capTable;
        local_2b8[0].capTable = (CapTableReader *)pSVar18->data;
        pSVar5 = (SegmentReader *)pSVar18[-1].pointers;
        pSVar7 = pSVar18;
        while (pSVar11 < pSVar5) {
          pSVar7->data = *(WirePointer **)&pSVar7[-1].nestingLimit;
          pCVar6 = *(CapTableReader **)&pSVar7[-1].dataSize;
          pSVar7->segment = (SegmentReader *)pSVar7[-1].pointers;
          pSVar7->capTable = pCVar6;
          pSVar5 = (pSVar7 + -2)[1].segment;
          pSVar7 = (StructReader *)&pSVar7[-1].pointers;
        }
        pSVar7->segment = pSVar11;
        pSVar7->capTable = (CapTableReader *)local_2b8[0].segment;
        pSVar7->data = local_2b8[0].capTable;
        pSVar18 = (StructReader *)&pSVar18->pointers;
      } while (pSVar18 != (StructReader *)ppSVar1);
    }
  }
  AVar20.size_ = uVar15;
  AVar20.ptr = (Scope *)__s_00;
  AVar20 = copyDeduped<capnp::_::RawBrandedSchema::Scope>(this,AVar20);
  pRVar12 = makeBranded(this,schema,AVar20);
  if (local_458 != (StructReader *)0x0) {
    (**(code **)*local_448)(local_448,local_458,0x18,uStack_450,uStack_450,0);
  }
  return pRVar12;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, schema::Brand::Reader proto,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> clientBrand) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  auto srcScopes = proto.getScopes();

  KJ_STACK_ARRAY(_::RawBrandedSchema::Scope, dstScopes, srcScopes.size(), 16, 32);
  memset(dstScopes.begin(), 0, dstScopes.size() * sizeof(dstScopes[0]));

  uint dstScopeCount = 0;
  for (auto srcScope: srcScopes) {
    switch (srcScope.which()) {
      case schema::Brand::Scope::BIND: {
        auto srcBindings = srcScope.getBind();
        KJ_STACK_ARRAY(_::RawBrandedSchema::Binding, dstBindings, srcBindings.size(), 16, 32);
        memset(dstBindings.begin(), 0, dstBindings.size() * sizeof(dstBindings[0]));

        for (auto j: kj::indices(srcBindings)) {
          auto srcBinding = srcBindings[j];
          auto& dstBinding = dstBindings[j];

          memset(&dstBinding, 0, sizeof(dstBinding));
          dstBinding.which = schema::Type::ANY_POINTER;

          switch (srcBinding.which()) {
            case schema::Brand::Binding::UNBOUND:
              break;
            case schema::Brand::Binding::TYPE: {
              makeDep(dstBinding, srcBinding.getType(), scopeName, clientBrand);
              break;
            }
          }
        }

        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();
        dstScope.bindingCount = dstBindings.size();
        dstScope.bindings = copyDeduped(dstBindings).begin();
        break;
      }
      case schema::Brand::Scope::INHERIT: {
        // Inherit the whole scope from the client -- or if the client doesn't have it, at least
        // include an empty dstScope in the list just to show that this scope was specified as
        // inherited, as opposed to being unspecified (which would be treated as all AnyPointer).
        auto& dstScope = dstScopes[dstScopeCount++];
        dstScope.typeId = srcScope.getScopeId();

        KJ_IF_SOME(b, clientBrand) {
          for (auto& clientScope: b) {
            if (clientScope.typeId == dstScope.typeId) {
              // Overwrite the whole thing.
              dstScope = clientScope;
              break;
            }
          }
        } else {
          dstScope.isUnbound = true;
        }
        break;
      }
    }
  }